

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeModuleBuildLogDestroy(ze_module_build_log_handle_t hModuleBuildLog)

{
  _ze_module_build_log_handle_t *_key;
  ze_pfnModuleBuildLogDestroy_t pfnDestroy;
  dditable_t *dditable;
  ze_result_t result;
  ze_module_build_log_handle_t hModuleBuildLog_local;
  
  if (*(code **)(*(long *)(hModuleBuildLog + 8) + 0x540) == (code *)0x0) {
    hModuleBuildLog_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_module_build_log_handle_t **)hModuleBuildLog;
    hModuleBuildLog_local._4_4_ = (**(code **)(*(long *)(hModuleBuildLog + 8) + 0x540))(_key);
    if (hModuleBuildLog_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_module_build_log_handle_t_*>,__ze_module_build_log_handle_t_*>
      ::release((singleton_factory_t<object_t<_ze_module_build_log_handle_t_*>,__ze_module_build_log_handle_t_*>
                 *)(context + 0x4e0),_key);
    }
  }
  return hModuleBuildLog_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleBuildLogDestroy(
        ze_module_build_log_handle_t hModuleBuildLog    ///< [in][release] handle of the module build log object.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_build_log_object_t*>( hModuleBuildLog )->dditable;
        auto pfnDestroy = dditable->ze.ModuleBuildLog.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hModuleBuildLog = reinterpret_cast<ze_module_build_log_object_t*>( hModuleBuildLog )->handle;

        // forward to device-driver
        result = pfnDestroy( hModuleBuildLog );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_module_build_log_factory.release( hModuleBuildLog );

        return result;
    }